

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetSourceFilePropertyCommand::InitialPass
          (cmGetSourceFilePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  char *pcVar2;
  cmMakefile *pcVar3;
  int iVar4;
  cmSourceFile *this_00;
  char *pcVar5;
  long lVar6;
  string local_78;
  allocator local_51;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 == 0x60) {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    pcVar5 = pbVar1[1]._M_dataplus._M_p;
    pcVar3 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_78,pcVar5,(allocator *)&local_50);
    this_00 = cmMakefile::GetSource(pcVar3,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (this_00 == (cmSourceFile *)0x0) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      if (iVar4 == 0) {
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_78,pcVar5,(allocator *)&local_50);
        this_00 = cmMakefile::CreateSource(pcVar3,&local_78,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (this_00 != (cmSourceFile *)0x0) goto LAB_0029c299;
      }
LAB_0029c372:
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_78,pcVar2,(allocator *)&local_50);
      cmMakefile::AddDefinition(pcVar3,&local_78,"NOTFOUND");
    }
    else {
LAB_0029c299:
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      if (iVar4 == 0) {
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_78,pcVar2,&local_51);
        cmSourceFile::GetLanguage_abi_cxx11_(&local_50,this_00);
        cmMakefile::AddDefinition(pcVar3,&local_78,local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((pbVar1[2]._M_string_length == 0) ||
           (pcVar5 = cmSourceFile::GetPropertyForUser(this_00,pbVar1 + 2), pcVar5 == (char *)0x0))
        goto LAB_0029c372;
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_78,pcVar2,(allocator *)&local_50);
        cmMakefile::AddDefinition(pcVar3,&local_78,pcVar5);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0029c341;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0029c341;
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0029c341:
  return lVar6 == 0x60;
}

Assistant:

bool cmGetSourceFilePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* var = args[0].c_str();
  const char* file = args[1].c_str();
  cmSourceFile* sf = this->Makefile->GetSource(file);

  // for the location we must create a source file first
  if (!sf && args[2] == "LOCATION")
    {
    sf = this->Makefile->CreateSource(file);
    }
  if(sf)
    {
    if(args[2] == "LANGUAGE")
      {
      this->Makefile->AddDefinition(var, sf->GetLanguage().c_str());
      return true;
      }
    const char *prop = 0;
    if (!args[2].empty())
      {
      prop = sf->GetPropertyForUser(args[2]);
      }
    if (prop)
      {
      this->Makefile->AddDefinition(var, prop);
      return true;
      }
    }

  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}